

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O3

void __thiscall
ezc3d::c3d::setGroupMetadata(c3d *this,string *groupName,string *description,bool isLocked)

{
  size_t idx;
  Group *pGVar1;
  
  idx = ParametersNS::Parameters::groupIdx
                  ((this->_parameters).
                   super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,groupName);
  pGVar1 = ParametersNS::Parameters::group
                     ((this->_parameters).
                      super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,idx);
  ParametersNS::GroupNS::Group::description(pGVar1,description);
  pGVar1 = ParametersNS::Parameters::group
                     ((this->_parameters).
                      super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,idx);
  if (isLocked) {
    ParametersNS::GroupNS::Group::lock(pGVar1);
  }
  else {
    ParametersNS::GroupNS::Group::unlock(pGVar1);
  }
  return;
}

Assistant:

void ezc3d::c3d::setGroupMetadata(const std::string &groupName,
                                  const std::string &description,
                                  bool isLocked) {
  size_t idx;
  try {
    idx = parameters().groupIdx(groupName);
  } catch (const std::invalid_argument&) {
    _parameters->group(ezc3d::ParametersNS::GroupNS::Group(groupName));
    idx = parameters().groupIdx(groupName);
  }

  _parameters->group(idx).description(description);
  if (isLocked) {
    _parameters->group(idx).lock();
  } else {
    _parameters->group(idx).unlock();
  }
}